

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.h
# Opt level: O1

void __thiscall Population::setInput(Population *this,int neuronIndex,Event *e)

{
  pointer ppNVar1;
  Neuron *pNVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  
  if (-1 < neuronIndex) {
    ppNVar1 = (this->neurons).super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)(uint)neuronIndex <
        (ulong)((long)(this->neurons).super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3)) {
      pNVar2 = ppNVar1[(uint)neuronIndex];
      (*pNVar2->_vptr_Neuron[1])(pNVar2,e);
      return;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Index of input neuron out of range!");
  std::endl<char,std::char_traits<char>>(poVar3);
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "Index of input neuron out of range!";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

virtual void setInput(int neuronIndex, Event* e) {
        if(neuronIndex < 0 || neuronIndex >= neurons.size()) {
            std::cout << "Index of input neuron out of range!" << std::endl;
            throw "Index of input neuron out of range!";
        }
        neurons[neuronIndex]->handleEvent(e);

    }